

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O0

void ssh_detect_bugs(ssh_verstring_state *s)

{
  LogContext *pLVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *imp;
  BinaryPacketProtocol *bpp;
  ssh_verstring_state *s_local;
  
  pcVar4 = s->softwareversion;
  s->remote_bugs = 0;
  iVar2 = conf_get_int(s->conf,0xb1);
  if ((iVar2 == 0) ||
     ((iVar2 = conf_get_int(s->conf,0xb1), iVar2 == 2 &&
      ((((iVar2 = strcmp(pcVar4,"1.2.18"), iVar2 == 0 ||
         (iVar2 = strcmp(pcVar4,"1.2.19"), iVar2 == 0)) ||
        (iVar2 = strcmp(pcVar4,"1.2.20"), iVar2 == 0)) ||
       (((iVar2 = strcmp(pcVar4,"1.2.21"), iVar2 == 0 ||
         (iVar2 = strcmp(pcVar4,"1.2.22"), iVar2 == 0)) ||
        ((iVar2 = strcmp(pcVar4,"Cisco-1.25"), iVar2 == 0 ||
         ((iVar2 = strcmp(pcVar4,"OSU_1.4alpha3"), iVar2 == 0 ||
          (iVar2 = strcmp(pcVar4,"OSU_1.5alpha4"), iVar2 == 0)))))))))))) {
    s->remote_bugs = s->remote_bugs | 1;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has SSH-1 ignore bug");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xb2);
  if ((iVar2 == 0) ||
     ((iVar2 = conf_get_int(s->conf,0xb2), iVar2 == 2 &&
      ((iVar2 = strcmp(pcVar4,"Cisco-1.25"), iVar2 == 0 ||
       (iVar2 = strcmp(pcVar4,"OSU_1.4alpha3"), iVar2 == 0)))))) {
    s->remote_bugs = s->remote_bugs | 4;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version needs a plain SSH-1 password");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xb3);
  if ((iVar2 == 0) ||
     ((iVar2 = conf_get_int(s->conf,0xb3), iVar2 == 2 &&
      (iVar2 = strcmp(pcVar4,"Cisco-1.25"), iVar2 == 0)))) {
    s->remote_bugs = s->remote_bugs | 8;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version can\'t handle SSH-1 RSA authentication");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xb4);
  if ((iVar2 == 0) ||
     (((iVar2 = conf_get_int(s->conf,0xb4), iVar2 == 2 &&
       (iVar2 = wc_match("* VShell",pcVar4), iVar2 == 0)) &&
      (((iVar2 = wc_match("2.1.0*",pcVar4), iVar2 != 0 ||
        (((iVar2 = wc_match("2.0.*",pcVar4), iVar2 != 0 ||
          (iVar2 = wc_match("2.2.0*",pcVar4), iVar2 != 0)) ||
         (iVar2 = wc_match("2.3.0*",pcVar4), iVar2 != 0)))) ||
       (iVar2 = wc_match("2.1 *",pcVar4), iVar2 != 0)))))) {
    s->remote_bugs = s->remote_bugs | 2;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has SSH-2 HMAC bug");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xb5);
  if ((iVar2 == 0) ||
     (((iVar2 = conf_get_int(s->conf,0xb5), iVar2 == 2 &&
       (iVar2 = wc_match("* VShell",pcVar4), iVar2 == 0)) &&
      ((iVar2 = wc_match("2.0.0*",pcVar4), iVar2 != 0 ||
       (iVar2 = wc_match("2.0.10*",pcVar4), iVar2 != 0)))))) {
    s->remote_bugs = s->remote_bugs | 0x20;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has SSH-2 key-derivation bug");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xb6);
  if ((iVar2 == 0) ||
     ((iVar2 = conf_get_int(s->conf,0xb6), iVar2 == 2 &&
      (((iVar2 = wc_match("OpenSSH_2.[5-9]*",pcVar4), iVar2 != 0 ||
        (iVar2 = wc_match("OpenSSH_3.[0-2]*",pcVar4), iVar2 != 0)) ||
       ((iVar2 = wc_match("mod_sftp/0.[0-8]*",pcVar4), iVar2 != 0 ||
        (iVar2 = wc_match("mod_sftp/0.9.[0-8]",pcVar4), iVar2 != 0)))))))) {
    s->remote_bugs = s->remote_bugs | 0x10;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has SSH-2 RSA padding bug");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xb7);
  if ((iVar2 == 0) ||
     ((iVar2 = conf_get_int(s->conf,0xb7), iVar2 == 2 &&
      (iVar2 = wc_match("OpenSSH_2.[0-2]*",pcVar4), iVar2 != 0)))) {
    s->remote_bugs = s->remote_bugs | 0x80;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has SSH-2 public-key-session-ID bug");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xb8);
  if ((iVar2 == 0) ||
     ((iVar2 = conf_get_int(s->conf,0xb8), iVar2 == 2 &&
      (((((iVar2 = wc_match("DigiSSH_2.0",pcVar4), iVar2 != 0 ||
          (iVar2 = wc_match("OpenSSH_2.[0-4]*",pcVar4), iVar2 != 0)) ||
         (iVar2 = wc_match("OpenSSH_2.5.[0-3]*",pcVar4), iVar2 != 0)) ||
        ((iVar2 = wc_match("Sun_SSH_1.0",pcVar4), iVar2 != 0 ||
         (iVar2 = wc_match("Sun_SSH_1.0.1",pcVar4), iVar2 != 0)))) ||
       (iVar2 = wc_match("WeOnlyDo-*",pcVar4), iVar2 != 0)))))) {
    s->remote_bugs = s->remote_bugs | 0x40;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has SSH-2 rekey bug");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xb9);
  if ((iVar2 == 0) ||
     ((iVar2 = conf_get_int(s->conf,0xb9), iVar2 == 2 &&
      ((iVar2 = wc_match("1.36_sshlib GlobalSCAPE",pcVar4), iVar2 != 0 ||
       (iVar2 = wc_match("1.36 sshlib: GlobalScape",pcVar4), iVar2 != 0)))))) {
    s->remote_bugs = s->remote_bugs | 0x100;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version ignores SSH-2 maximum packet size");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xba);
  if (iVar2 == 0) {
    s->remote_bugs = s->remote_bugs | 0x200;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has SSH-2 ignore bug");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xbb);
  if ((iVar2 == 0) ||
     ((iVar2 = conf_get_int(s->conf,0xbb), iVar2 == 2 &&
      (iVar2 = wc_match("OpenSSH_2.[235]*",pcVar4), iVar2 != 0)))) {
    s->remote_bugs = s->remote_bugs | 0x1000;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has outdated SSH-2 GEX");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xbc);
  if (iVar2 == 0) {
    s->remote_bugs = s->remote_bugs | 0x400;
    pLVar1 = (s->bpp).logctx;
    pcVar3 = dupprintf("We believe remote version has winadj bug");
    logevent_and_free(pLVar1,pcVar3);
  }
  iVar2 = conf_get_int(s->conf,0xbd);
  if (iVar2 != 0) {
    iVar2 = conf_get_int(s->conf,0xbd);
    if (iVar2 != 2) {
      return;
    }
    iVar2 = wc_match("OpenSSH_[2-5].*",pcVar4);
    if ((((iVar2 == 0) && (iVar2 = wc_match("OpenSSH_6.[0-6]*",pcVar4), iVar2 == 0)) &&
        (iVar2 = wc_match("dropbear_0.[2-4][0-9]*",pcVar4), iVar2 == 0)) &&
       (iVar2 = wc_match("dropbear_0.5[01]*",pcVar4), iVar2 == 0)) {
      return;
    }
  }
  s->remote_bugs = s->remote_bugs | 0x800;
  pLVar1 = (s->bpp).logctx;
  pcVar4 = dupprintf("We believe remote version has SSH-2 channel request bug");
  logevent_and_free(pLVar1,pcVar4);
  return;
}

Assistant:

static void ssh_detect_bugs(struct ssh_verstring_state *s)
{
    BinaryPacketProtocol *bpp = &s->bpp; /* for bpp_logevent */
    const char *imp = s->softwareversion;

    s->remote_bugs = 0;

    /*
     * General notes on server version strings:
     *  - Not all servers reporting "Cisco-1.25" have all the bugs listed
     *    here -- in particular, we've heard of one that's perfectly happy
     *    with SSH1_MSG_IGNOREs -- but this string never seems to change,
     *    so we can't distinguish them.
     */
    if (conf_get_int(s->conf, CONF_sshbug_ignore1) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_ignore1) == AUTO &&
         (!strcmp(imp, "1.2.18") || !strcmp(imp, "1.2.19") ||
          !strcmp(imp, "1.2.20") || !strcmp(imp, "1.2.21") ||
          !strcmp(imp, "1.2.22") || !strcmp(imp, "Cisco-1.25") ||
          !strcmp(imp, "OSU_1.4alpha3") || !strcmp(imp, "OSU_1.5alpha4")))) {
        /*
         * These versions don't support SSH1_MSG_IGNORE, so we have
         * to use a different defence against password length
         * sniffing.
         */
        s->remote_bugs |= BUG_CHOKES_ON_SSH1_IGNORE;
        bpp_logevent("We believe remote version has SSH-1 ignore bug");
    }

    if (conf_get_int(s->conf, CONF_sshbug_plainpw1) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_plainpw1) == AUTO &&
         (!strcmp(imp, "Cisco-1.25") || !strcmp(imp, "OSU_1.4alpha3")))) {
        /*
         * These versions need a plain password sent; they can't
         * handle having a null and a random length of data after
         * the password.
         */
        s->remote_bugs |= BUG_NEEDS_SSH1_PLAIN_PASSWORD;
        bpp_logevent("We believe remote version needs a "
                     "plain SSH-1 password");
    }

    if (conf_get_int(s->conf, CONF_sshbug_rsa1) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_rsa1) == AUTO &&
         (!strcmp(imp, "Cisco-1.25")))) {
        /*
         * These versions apparently have no clue whatever about
         * RSA authentication and will panic and die if they see
         * an AUTH_RSA message.
         */
        s->remote_bugs |= BUG_CHOKES_ON_RSA;
        bpp_logevent("We believe remote version can't handle SSH-1 "
                     "RSA authentication");
    }

    if (conf_get_int(s->conf, CONF_sshbug_hmac2) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_hmac2) == AUTO &&
         !wc_match("* VShell", imp) &&
         (wc_match("2.1.0*", imp) || wc_match("2.0.*", imp) ||
          wc_match("2.2.0*", imp) || wc_match("2.3.0*", imp) ||
          wc_match("2.1 *", imp)))) {
        /*
         * These versions have the HMAC bug.
         */
        s->remote_bugs |= BUG_SSH2_HMAC;
        bpp_logevent("We believe remote version has SSH-2 HMAC bug");
    }

    if (conf_get_int(s->conf, CONF_sshbug_derivekey2) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_derivekey2) == AUTO &&
         !wc_match("* VShell", imp) &&
         (wc_match("2.0.0*", imp) || wc_match("2.0.10*", imp) ))) {
        /*
         * These versions have the key-derivation bug (failing to
         * include the literal shared secret in the hashes that
         * generate the keys).
         */
        s->remote_bugs |= BUG_SSH2_DERIVEKEY;
        bpp_logevent("We believe remote version has SSH-2 "
                     "key-derivation bug");
    }

    if (conf_get_int(s->conf, CONF_sshbug_rsapad2) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_rsapad2) == AUTO &&
         (wc_match("OpenSSH_2.[5-9]*", imp) ||
          wc_match("OpenSSH_3.[0-2]*", imp) ||
          wc_match("mod_sftp/0.[0-8]*", imp) ||
          wc_match("mod_sftp/0.9.[0-8]", imp)))) {
        /*
         * These versions have the SSH-2 RSA padding bug.
         */
        s->remote_bugs |= BUG_SSH2_RSA_PADDING;
        bpp_logevent("We believe remote version has SSH-2 RSA padding bug");
    }

    if (conf_get_int(s->conf, CONF_sshbug_pksessid2) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_pksessid2) == AUTO &&
         wc_match("OpenSSH_2.[0-2]*", imp))) {
        /*
         * These versions have the SSH-2 session-ID bug in
         * public-key authentication.
         */
        s->remote_bugs |= BUG_SSH2_PK_SESSIONID;
        bpp_logevent("We believe remote version has SSH-2 "
                     "public-key-session-ID bug");
    }

    if (conf_get_int(s->conf, CONF_sshbug_rekey2) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_rekey2) == AUTO &&
         (wc_match("DigiSSH_2.0", imp) ||
          wc_match("OpenSSH_2.[0-4]*", imp) ||
          wc_match("OpenSSH_2.5.[0-3]*", imp) ||
          wc_match("Sun_SSH_1.0", imp) ||
          wc_match("Sun_SSH_1.0.1", imp) ||
          /* All versions <= 1.2.6 (they changed their format in 1.2.7) */
          wc_match("WeOnlyDo-*", imp)))) {
        /*
         * These versions have the SSH-2 rekey bug.
         */
        s->remote_bugs |= BUG_SSH2_REKEY;
        bpp_logevent("We believe remote version has SSH-2 rekey bug");
    }

    if (conf_get_int(s->conf, CONF_sshbug_maxpkt2) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_maxpkt2) == AUTO &&
         (wc_match("1.36_sshlib GlobalSCAPE", imp) ||
          wc_match("1.36 sshlib: GlobalScape", imp)))) {
        /*
         * This version ignores our makpkt and needs to be throttled.
         */
        s->remote_bugs |= BUG_SSH2_MAXPKT;
        bpp_logevent("We believe remote version ignores SSH-2 "
                     "maximum packet size");
    }

    if (conf_get_int(s->conf, CONF_sshbug_ignore2) == FORCE_ON) {
        /*
         * Servers that don't support SSH2_MSG_IGNORE. Currently,
         * none detected automatically.
         */
        s->remote_bugs |= BUG_CHOKES_ON_SSH2_IGNORE;
        bpp_logevent("We believe remote version has SSH-2 ignore bug");
    }

    if (conf_get_int(s->conf, CONF_sshbug_oldgex2) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_oldgex2) == AUTO &&
         (wc_match("OpenSSH_2.[235]*", imp)))) {
        /*
         * These versions only support the original (pre-RFC4419)
         * SSH-2 GEX request, and disconnect with a protocol error if
         * we use the newer version.
         */
        s->remote_bugs |= BUG_SSH2_OLDGEX;
        bpp_logevent("We believe remote version has outdated SSH-2 GEX");
    }

    if (conf_get_int(s->conf, CONF_sshbug_winadj) == FORCE_ON) {
        /*
         * Servers that don't support our winadj request for one
         * reason or another. Currently, none detected automatically.
         */
        s->remote_bugs |= BUG_CHOKES_ON_WINADJ;
        bpp_logevent("We believe remote version has winadj bug");
    }

    if (conf_get_int(s->conf, CONF_sshbug_chanreq) == FORCE_ON ||
        (conf_get_int(s->conf, CONF_sshbug_chanreq) == AUTO &&
         (wc_match("OpenSSH_[2-5].*", imp) ||
          wc_match("OpenSSH_6.[0-6]*", imp) ||
          wc_match("dropbear_0.[2-4][0-9]*", imp) ||
          wc_match("dropbear_0.5[01]*", imp)))) {
        /*
         * These versions have the SSH-2 channel request bug.
         * OpenSSH 6.7 and above do not:
         * https://bugzilla.mindrot.org/show_bug.cgi?id=1818
         * dropbear_0.52 and above do not:
         * https://secure.ucc.asn.au/hg/dropbear/rev/cd02449b709c
         */
        s->remote_bugs |= BUG_SENDS_LATE_REQUEST_REPLY;
        bpp_logevent("We believe remote version has SSH-2 "
                     "channel request bug");
    }
}